

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeDeltaTo(UCharsTrieBuilder *this,int32_t jumpTarget)

{
  short sVar1;
  ssize_t sVar2;
  undefined6 in_register_0000000a;
  int local_2c;
  short local_26;
  int32_t length;
  uint uStack_20;
  UChar intUnits [3];
  int32_t i;
  int32_t jumpTarget_local;
  UCharsTrieBuilder *this_local;
  
  uStack_20 = this->ucharsLength - jumpTarget;
  intUnits._2_4_ = jumpTarget;
  if ((int)uStack_20 < 0xfc00) {
    this_local._4_4_ =
         (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])(this,(ulong)uStack_20);
  }
  else {
    sVar1 = (short)(uStack_20 >> 0x10);
    if ((int)uStack_20 < 0x3ff0000) {
      local_26 = sVar1 + -0x400;
      local_2c = 1;
    }
    else {
      local_26 = -1;
      local_2c = 2;
      length._0_2_ = sVar1;
    }
    (&local_26)[local_2c] = (short)uStack_20;
    sVar2 = write(this,(int)&local_26,(void *)(ulong)(local_2c + 1),
                  CONCAT62(in_register_0000000a,(short)uStack_20));
    this_local._4_4_ = (int)sVar2;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UCharsTrieBuilder::writeDeltaTo(int32_t jumpTarget) {
    int32_t i=ucharsLength-jumpTarget;
    U_ASSERT(i>=0);
    if(i<=UCharsTrie::kMaxOneUnitDelta) {
        return write(i);
    }
    UChar intUnits[3];
    int32_t length;
    if(i<=UCharsTrie::kMaxTwoUnitDelta) {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitDeltaLead+(i>>16));
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitDeltaLead);
        intUnits[1]=(UChar)(i>>16);
        length=2;
    }
    intUnits[length++]=(UChar)i;
    return write(intUnits, length);
}